

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
         *this)

{
  double *pdVar1;
  qpTestLog *pqVar2;
  ostringstream *poVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  float fVar6;
  Precision PVar7;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar8;
  Statement *pSVar9;
  ShaderExecutor *pSVar10;
  Variable<tcu::Vector<float,_2>_> *pVVar11;
  pointer pcVar12;
  Variable<tcu::Matrix<float,_2,_3>_> *pVVar13;
  Variable<tcu::Vector<float,_3>_> *pVVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  pointer pVVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int iVar21;
  uint uVar22;
  _Rb_tree_node_base *p_Var23;
  long lVar24;
  IVal *pIVar25;
  IVal *pIVar26;
  IVal *pIVar27;
  undefined8 *puVar28;
  string *psVar29;
  Vector<float,_2> *val;
  undefined1 *puVar30;
  TestLog TVar31;
  qpTestLog *pqVar32;
  TestLog *pTVar33;
  FloatFormat *pFVar34;
  TestStatus *pTVar35;
  byte bVar36;
  IVal in2;
  IVal in1;
  IVal in3;
  FuncSet funcs;
  FloatFormat highpFmt;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_> outputs;
  IVal reference0;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  float in_stack_fffffffffffffa68;
  float fVar37;
  size_type local_590;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  undefined1 local_578 [16];
  undefined1 local_568 [64];
  string local_528;
  ulong local_508;
  FloatFormat *local_500;
  TestStatus *local_4f8;
  undefined1 local_4f0 [12];
  YesNoMaybe YStack_4e4;
  TestLog TStack_4e0;
  _Rb_tree_node_base *local_4d8;
  _Base_ptr local_4d0;
  double dStack_4c8;
  FloatFormat local_4a8;
  long local_478;
  long local_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_468;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
  local_438;
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  double local_3e8;
  Precision PStack_3e0;
  undefined4 uStack_3dc;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_3d8;
  undefined4 local_3d0;
  ios_base local_398 [8];
  ios_base local_390 [264];
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  undefined1 local_1a8 [376];
  
  bVar36 = 0;
  this_00 = this->m_samplings;
  pFVar34 = &(this->m_caseCtx).floatFormat;
  PVar7 = (this->m_caseCtx).precision;
  sVar8 = (this->m_caseCtx).numRandoms;
  local_4f8 = __return_storage_ptr__;
  iVar21 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_500 = pFVar34;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar34,(FloatFormat *)(ulong)PVar7,(Precision)sVar8,(ulong)(iVar21 + 0xdeadbeef),
             (deUint32)in_stack_fffffffffffffa68);
  pVVar17 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_568._56_8_ =
       (long)local_278.in0.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_278.in0.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>::Outputs
            (&local_438,local_568._56_8_);
  local_4a8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_4a8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_4a8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_4a8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_4a8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_4a8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_4a8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_4a8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_4a8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_468._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_468._M_impl.super__Rb_tree_header._M_header;
  local_468._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_468._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_468._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_468._M_impl.super__Rb_tree_header._M_header._M_right =
       local_468._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_568._32_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_438.out0.
              super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_280 = local_438.out1.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_408 + 8);
  local_408._0_8_ = local_568._32_8_;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(false);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_390);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var4 = (_Rb_tree_node_base *)(local_4f0 + 8);
  stack0xfffffffffffffb18 = (double)((ulong)YStack_4e4 << 0x20);
  TStack_4e0.m_log = (qpTestLog *)0x0;
  dStack_4c8 = 0.0;
  pSVar9 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_4d8 = p_Var4;
  local_4d0 = p_Var4;
  (*pSVar9->_vptr_Statement[4])(pSVar9,local_4f0);
  if (local_4d8 != p_Var4) {
    p_Var23 = local_4d8;
    do {
      (**(code **)(**(long **)(p_Var23 + 1) + 0x30))(*(long **)(p_Var23 + 1),local_1a8);
      p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
    } while (p_Var23 != p_Var4);
  }
  if (dStack_4c8 != 0.0) {
    poVar3 = (ostringstream *)(local_408 + 8);
    local_408._0_8_ = local_568._32_8_;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(char *)local_578._0_8_,local_578._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_578._0_8_ != (IVal *)local_568) {
      operator_delete((void *)local_578._0_8_,local_568._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_390);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_4f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  pSVar10 = (this->m_executor).
            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            .m_data.ptr;
  (*pSVar10->_vptr_ShaderExecutor[2])(pSVar10,local_568._56_8_,&local_218,&local_288,0);
  local_4f0[0] = false;
  stack0xfffffffffffffb18 = INFINITY;
  TStack_4e0.m_log = (qpTestLog *)0xfff0000000000000;
  local_4d8 = (_Rb_tree_node_base *)((ulong)local_4d8 & 0xffffffffffffff00);
  local_4d0 = (_Base_ptr)0x7ff0000000000000;
  dStack_4c8 = -INFINITY;
  tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_408);
  pFVar34 = local_500;
  lVar24 = 8;
  do {
    local_1a8[lVar24 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar24) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar24 + 8) = 0xfff0000000000000;
    lVar24 = lVar24 + 0x18;
  } while (lVar24 != 0x50);
  lVar24 = 8;
  do {
    local_1a8[lVar24 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar24) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar24 + 8) = 0xfff0000000000000;
    lVar24 = lVar24 + 0x18;
  } while (lVar24 != 0x50);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_468,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_4f0);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_468,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_578);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_468,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffffa68);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_468,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)(local_568 + 0x40));
  Environment::bind<tcu::Matrix<float,2,3>>
            ((Environment *)&local_468,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_ptr,
             (IVal *)local_408);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_468,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr,
             (IVal *)local_1a8);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar17) {
LAB_0095c9f0:
    poVar3 = (ostringstream *)(local_408 + 8);
    local_408._0_8_ = local_568._32_8_;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    pTVar35 = local_4f8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_390);
    local_408._0_8_ = (TestLog *)local_3f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Pass","");
    pTVar35->m_code = QP_TEST_RESULT_PASS;
    (pTVar35->m_description)._M_dataplus._M_p = (pointer)&(pTVar35->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar35->m_description,local_408._0_8_,
               (pointer)(local_408._0_8_ + CONCAT44(local_408._12_4_,local_408._8_4_)));
    if ((TestLog *)local_408._0_8_ == (TestLog *)local_3f8) goto LAB_0095cbd8;
    TVar31.m_log = (qpTestLog *)CONCAT44(local_3f8._4_4_,local_3f8._0_4_);
    pTVar33 = (TestLog *)local_408._0_8_;
  }
  else {
    local_478 = local_568._56_8_ + (ulong)((double)local_568._56_8_ == 0.0);
    local_568._48_8_ = 0;
    local_508 = 0;
    local_568._40_8_ = this;
    do {
      uVar16 = local_568._40_8_;
      tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_1a8);
      lVar24 = 8;
      do {
        *(undefined1 *)((long)&local_4f8 + lVar24) = 0;
        *(undefined8 *)(local_4f0 + lVar24) = 0x7ff0000000000000;
        *(undefined8 *)(local_4f0 + lVar24 + 8) = 0xfff0000000000000;
        lVar24 = lVar24 + 0x18;
      } while (lVar24 != 0x50);
      lVar24 = 8;
      do {
        *(undefined1 *)((long)&local_4f8 + lVar24) = 0;
        *(undefined8 *)(local_4f0 + lVar24) = 0x7ff0000000000000;
        *(undefined8 *)(local_4f0 + lVar24 + 8) = 0xfff0000000000000;
        lVar24 = lVar24 + 0x18;
      } while (lVar24 != 0x50);
      fVar37 = local_278.in0.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start[local_568._48_8_].m_data[0];
      fVar6 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start[local_568._48_8_].m_data[1];
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_578,pFVar34,(Vector<float,_2> *)&stack0xfffffffffffffa68);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_408,pFVar34,(IVal *)local_578);
      pIVar25 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_468,
                           (((Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
                              *)(uVar16 + 0x98))->in0).
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar25->m_data[1].m_lo = local_3e8;
      pIVar25->m_data[1].m_hi = (double)CONCAT44(uStack_3dc,PStack_3e0);
      pIVar25->m_data[0].m_hi = (double)CONCAT44(local_3f8._4_4_,local_3f8._0_4_);
      *(ulong *)(pIVar25->m_data + 1) = CONCAT44(local_3f8._12_4_,local_3f8._8_4_);
      *(undefined8 *)pIVar25->m_data = local_408._0_8_;
      pIVar25->m_data[0].m_lo = (double)CONCAT44(local_408._12_4_,local_408._8_4_);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_468,
                 (((Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
                    *)(uVar16 + 0x98))->in1).
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_468,
                 (((Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
                    *)(uVar16 + 0x98))->in2).
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_468,
                 (((Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
                    *)(uVar16 + 0x98))->in3).
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      PStack_3e0 = ((CaseContext *)(uVar16 + 0x10))->precision;
      local_3e8 = pFVar34->m_maxValue;
      local_408._0_8_ = *(undefined8 *)pFVar34;
      local_408._8_4_ = pFVar34->m_fractionBits;
      local_408._12_4_ = pFVar34->m_hasSubnormal;
      local_3f8._0_4_ = pFVar34->m_hasInf;
      local_3f8._4_4_ = pFVar34->m_hasNaN;
      local_3f8[8] = pFVar34->m_exactPrecision;
      local_3f8._9_3_ = *(undefined3 *)&pFVar34->field_0x19;
      local_3f8._12_4_ = *(undefined4 *)&pFVar34->field_0x1c;
      local_3d0 = 0;
      pSVar9 = (((StatementP *)(uVar16 + 0x100))->
               super_SharedPtr<const_vkt::shaderexecutor::Statement>).m_ptr;
      local_3d8 = &local_468;
      (*pSVar9->_vptr_Statement[3])(pSVar9,(string *)local_408);
      pIVar26 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_468,
                           (((Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
                              *)(uVar16 + 0x98))->out1).
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_408,&local_4a8,pIVar26);
      uVar16 = local_568._48_8_;
      psVar29 = (string *)local_408;
      pIVar26 = (IVal *)local_4f0;
      for (lVar24 = 9; lVar24 != 0; lVar24 = lVar24 + -1) {
        *(pointer *)pIVar26->m_data = (psVar29->_M_dataplus)._M_p;
        psVar29 = (string *)((long)psVar29 + (ulong)bVar36 * -0x10 + 8);
        pIVar26 = (IVal *)((long)pIVar26 + ((ulong)bVar36 * -2 + 1) * 8);
      }
      local_470 = local_568._48_8_ * 0xc;
      bVar18 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                         ((IVal *)local_4f0,
                          local_438.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_568._48_8_);
      local_408._0_8_ = local_3f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,"Shader output 1 is outside acceptable range","");
      bVar18 = tcu::ResultCollector::check(&local_1f8,bVar18,(string *)local_408);
      if ((TestLog *)local_408._0_8_ != (TestLog *)local_3f8) {
        operator_delete((void *)local_408._0_8_,CONCAT44(local_3f8._4_4_,local_3f8._0_4_) + 1);
      }
      pIVar27 = Environment::lookup<tcu::Matrix<float,2,3>>
                          ((Environment *)&local_468,
                           (((Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
                              *)(local_568._40_8_ + 0x98))->out0).
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doConvert
                ((IVal *)local_408,&local_4a8,pIVar27);
      psVar29 = (string *)local_408;
      puVar30 = local_1a8;
      bVar20 = true;
      do {
        bVar19 = bVar20;
        lVar24 = 0;
        do {
          *(undefined8 *)(puVar30 + lVar24 + 0x10) =
               *(undefined8 *)((long)&psVar29->field_2 + lVar24);
          puVar28 = (undefined8 *)((long)&(psVar29->_M_dataplus)._M_p + lVar24);
          uVar15 = puVar28[1];
          *(undefined8 *)(puVar30 + lVar24) = *puVar28;
          *(undefined8 *)((long)(puVar30 + lVar24) + 8) = uVar15;
          lVar24 = lVar24 + 0x30;
        } while (lVar24 != 0x90);
        psVar29 = (string *)(local_3f8 + 8);
        puVar30 = local_1a8 + 0x18;
        bVar20 = false;
      } while (bVar19);
      bVar20 = contains<tcu::Matrix<float,2,3>>
                         ((IVal *)local_1a8,
                          local_438.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar16);
      local_408._0_8_ = local_3f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,"Shader output 0 is outside acceptable range","");
      bVar20 = tcu::ResultCollector::check(&local_1f8,bVar20,(string *)local_408);
      if ((TestLog *)local_408._0_8_ != (TestLog *)local_3f8) {
        operator_delete((void *)local_408._0_8_,CONCAT44(local_3f8._4_4_,local_3f8._0_4_) + 1);
      }
      pFVar34 = local_500;
      if ((!bVar18 || !bVar20) &&
         (uVar22 = (int)local_508 + 1, local_508 = (ulong)uVar22, (int)uVar22 < 0x65)) {
        local_408._0_8_ = local_568._32_8_;
        poVar3 = (ostringstream *)(local_408 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar11 = (((Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
                     *)(local_568._40_8_ + 0x98))->in0).
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                  m_ptr;
        val = (Vector<float,_2> *)local_568;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        local_578._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_578,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_408 + 8),(char *)local_578._0_8_,local_578._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_408 + 8)," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)&stack0xfffffffffffffa68,(shaderexecutor *)&local_4a8,
                   (FloatFormat *)
                   (local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + local_568._48_8_),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_408 + 8),(char *)CONCAT44(fVar6,fVar37),local_590);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_408 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(fVar6,fVar37) != &local_588) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(fVar6,fVar37),local_588._M_allocated_capacity + 1);
        }
        if ((Vector<float,_2> *)local_578._0_8_ != (Vector<float,_2> *)local_568) {
          operator_delete((void *)local_578._0_8_,local_568._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_408 + 8),"\t",1);
        pVVar13 = (((Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
                     *)(local_568._40_8_ + 0x98))->out0).
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.
                  m_ptr;
        pIVar27 = (IVal *)local_568;
        pcVar12 = (pVVar13->m_name)._M_dataplus._M_p;
        local_578._0_8_ = pIVar27;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_578,pcVar12,pcVar12 + (pVVar13->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_408 + 8),(char *)local_578._0_8_,local_578._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_408 + 8)," = ",3);
        valueToString<tcu::Matrix<float,2,3>>
                  ((string *)&stack0xfffffffffffffa68,(shaderexecutor *)&local_4a8,
                   (FloatFormat *)
                   (local_438.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar16),
                   (Matrix<float,_2,_3> *)pIVar27);
        poVar5 = (ostream *)(local_408 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,(char *)CONCAT44(fVar6,fVar37),local_590);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,3>>
                  ((string *)(local_568 + 0x40),(shaderexecutor *)&local_4a8,
                   (FloatFormat *)local_1a8,pIVar27);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_528._M_dataplus._M_p,local_528._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(fVar6,fVar37) != &local_588) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(fVar6,fVar37),local_588._M_allocated_capacity + 1);
        }
        if ((IVal *)local_578._0_8_ != (IVal *)local_568) {
          operator_delete((void *)local_578._0_8_,local_568._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
        pVVar14 = (((Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_3>_>_>
                     *)(local_568._40_8_ + 0x98))->out1).
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
                  m_ptr;
        pIVar26 = (IVal *)local_568;
        pcVar12 = (pVVar14->m_name)._M_dataplus._M_p;
        local_578._0_8_ = pIVar26;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_578,pcVar12,pcVar12 + (pVVar14->m_name)._M_string_length);
        poVar5 = (ostream *)(local_408 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,(char *)local_578._0_8_,local_578._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)&stack0xfffffffffffffa68,(shaderexecutor *)&local_4a8,
                   (FloatFormat *)
                   ((long)(local_438.out1.
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_470),
                   (Vector<float,_3> *)pIVar26);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,(char *)CONCAT44(fVar6,fVar37),local_590);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,3>>
                  ((string *)(local_568 + 0x40),(shaderexecutor *)&local_4a8,
                   (FloatFormat *)local_4f0,pIVar26);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_528._M_dataplus._M_p,local_528._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(fVar6,fVar37) != &local_588) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(fVar6,fVar37),local_588._M_allocated_capacity + 1);
        }
        if ((IVal *)local_578._0_8_ != (IVal *)local_568) {
          operator_delete((void *)local_578._0_8_,local_568._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_408 + 8));
        std::ios_base::~ios_base(local_390);
      }
      local_568._48_8_ = local_568._48_8_ + 1;
    } while (local_568._48_8_ != local_478);
    iVar21 = (int)local_508;
    if (iVar21 < 0x65) {
      if (iVar21 == 0) goto LAB_0095c9f0;
    }
    else {
      poVar3 = (ostringstream *)(local_408 + 8);
      local_408._0_8_ = local_568._32_8_;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
      std::ostream::operator<<(poVar3,iVar21 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_390);
    }
    poVar3 = (ostringstream *)(local_408 + 8);
    local_408._0_8_ = local_568._32_8_;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_390);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
    std::ostream::operator<<(local_408,iVar21);
    pTVar35 = local_4f8;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
    std::ios_base::~ios_base(local_398);
    local_408._0_8_ = local_3f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_408," test failed. Check log for the details","");
    pqVar2 = (qpTestLog *)
             (CONCAT44(local_408._12_4_,local_408._8_4_) + (long)stack0xfffffffffffffb18);
    TVar31.m_log = (qpTestLog *)0xf;
    if ((TestLog *)CONCAT71(local_4f0._1_7_,local_4f0[0]) != &TStack_4e0) {
      TVar31.m_log = TStack_4e0.m_log;
    }
    if (TVar31.m_log < pqVar2) {
      pqVar32 = (qpTestLog *)0xf;
      if ((TestLog *)local_408._0_8_ != (TestLog *)local_3f8) {
        pqVar32 = (qpTestLog *)CONCAT44(local_3f8._4_4_,local_3f8._0_4_);
      }
      if (pqVar32 < pqVar2) goto LAB_0095c9de;
      puVar28 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)local_408,0,(char *)0x0,CONCAT71(local_4f0._1_7_,local_4f0[0]));
    }
    else {
LAB_0095c9de:
      puVar28 = (undefined8 *)std::__cxx11::string::_M_append(local_4f0,local_408._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pdVar1 = (double *)(puVar28 + 2);
    if ((double *)*puVar28 == pdVar1) {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._24_4_ = *(undefined4 *)(puVar28 + 3);
      local_1a8._28_4_ = *(undefined4 *)((long)puVar28 + 0x1c);
    }
    else {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._0_8_ = (double *)*puVar28;
    }
    local_1a8._8_8_ = puVar28[1];
    *puVar28 = pdVar1;
    puVar28[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar35->m_code = QP_TEST_RESULT_FAIL;
    (pTVar35->m_description)._M_dataplus._M_p = (pointer)&(pTVar35->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar35->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._0_8_));
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((TestLog *)local_408._0_8_ != (TestLog *)local_3f8) {
      operator_delete((void *)local_408._0_8_,CONCAT44(local_3f8._4_4_,local_3f8._0_4_) + 1);
    }
    pTVar33 = (TestLog *)CONCAT71(local_4f0._1_7_,local_4f0[0]);
    TVar31.m_log = TStack_4e0.m_log;
    if (pTVar33 == &TStack_4e0) goto LAB_0095cbd8;
  }
  operator_delete(pTVar33,(ulong)((long)&(TVar31.m_log)->flags + 1));
LAB_0095cbd8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_468);
  if (local_438.out1.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.out1.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_438.out0.
      super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar35;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}